

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

int main(void)

{
  uint8_t uVar1;
  uint8_t result;
  
  do {
    uVar1 = calculate();
    if (uVar1 == '\0') {
      std::operator<<((ostream *)&std::cout,"Execution completed");
    }
    else if (uVar1 == '\x01') {
      std::operator<<((ostream *)&std::cout,"Syntax ERROR");
    }
    std::ostream::operator<<((ostream *)&std::cout,std::endl<char,std::char_traits<char>>);
    ignore();
  } while( true );
}

Assistant:

int main() {
    while (true) {
        uint8_t result = calculate();
        switch (result) {
            case 0:
                cout << "Execution completed";
                break;
            case 1:
                cout << "Syntax ERROR";
        }
        cout << endl;
        ::ignore();
    }
}